

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evaluate.cc
# Opt level: O0

int board::evaluate::score(Board *pos)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int *piVar5;
  uint64_t *puVar6;
  int local_2c;
  int local_28;
  int i;
  int piece;
  int score;
  int side;
  int square;
  Board *pos_local;
  
  bVar2 = materialDraw(pos);
  if (bVar2) {
    pos_local._4_4_ = 0;
  }
  else {
    iVar3 = Board::getMaterial(pos,0);
    iVar4 = Board::getMaterial(pos,1);
    i = iVar3 - iVar4;
    iVar3 = Board::getPieceNum(pos,3);
    if (iVar3 == 2) {
      i = i + 0x1e;
    }
    iVar3 = Board::getPieceNum(pos,9);
    if (iVar3 == 2) {
      i = i + -0x1e;
    }
    for (local_28 = 1; local_28 < 0xd; local_28 = local_28 + 1) {
      for (local_2c = 0; iVar3 = Board::getPieceNum(pos,local_28), local_2c < iVar3;
          local_2c = local_2c + 1) {
        piVar5 = Board::getPieceList(pos,local_28);
        iVar3 = piVar5[local_2c];
        uVar1 = Board::PIECE_COLOR[local_28];
        if (Board::PIECE_COLOR[local_28] == 0) {
          iVar4 = *(int *)(PIECE_SQUARE_TABLE +
                          (long)Board::SQ64[iVar3] * 4 +
                          (long)Board::PIECE_NO_TEAM[local_28] * 0x100);
        }
        else {
          iVar4 = -*(int *)(PIECE_SQUARE_TABLE +
                           (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + (long)Board::SQ64[iVar3] * 4)
                           * 4 + (long)Board::PIECE_NO_TEAM[local_28] * 0x100);
        }
        i = iVar4 + i;
        if (local_28 == 6) {
          bVar2 = isEndGame(pos,0);
          if (bVar2) {
            iVar3 = *(int *)(PIECE_SQUARE_TABLE_KING_END + (long)Board::SQ64[iVar3] * 4);
          }
          else {
            iVar3 = *(int *)(PIECE_SQUARE_TABLE_KING_OPENING + (long)Board::SQ64[iVar3] * 4);
          }
          i = iVar3 + i;
        }
        else if (local_28 == 0xc) {
          bVar2 = isEndGame(pos,1);
          if (bVar2) {
            iVar3 = *(int *)(PIECE_SQUARE_TABLE_KING_END +
                            (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + (long)Board::SQ64[iVar3] * 4)
                            * 4);
          }
          else {
            iVar3 = *(int *)(PIECE_SQUARE_TABLE_KING_OPENING +
                            (long)*(int *)(MIRROR_PIECE_SQUARE_TABLE + (long)Board::SQ64[iVar3] * 4)
                            * 4);
          }
          i = i - iVar3;
        }
        else if (Board::PIECE_NO_TEAM[local_28] == 1) {
          puVar6 = Board::getPawns(pos);
          if (((ulong)(puVar6[(int)uVar1] == 0) & Board::ISOLATED_PAWN_MASK[Board::SQ64[iVar3]]) !=
              0) {
            iVar4 = -1;
            if (uVar1 == 0) {
              iVar4 = 1;
            }
            i = iVar4 * -10 + i;
          }
          puVar6 = Board::getPawns(pos);
          if (((ulong)(puVar6[(int)(uVar1 ^ 1)] == 0) &
              Board::PASSED_PAWN_MASK[(int)uVar1][Board::SQ64[iVar3]]) != 0) {
            iVar4 = -1;
            if (uVar1 == 0) {
              iVar4 = 1;
            }
            i = *(int *)(PASSED_PAWN + (long)Board::RANKS[iVar3] * 4) * iVar4 + i;
          }
        }
        else if (Board::PIECE_NO_TEAM[local_28] == 4) {
          puVar6 = Board::getPawns(pos);
          if (((ulong)(puVar6[2] == 0) & Board::FILE_MASK[Board::FILES[iVar3]]) == 0) {
            puVar6 = Board::getPawns(pos);
            if (((ulong)(puVar6[(int)uVar1] == 0) & Board::FILE_MASK[Board::FILES[iVar3]]) != 0) {
              iVar3 = -1;
              if (uVar1 == 0) {
                iVar3 = 1;
              }
              i = iVar3 * 5 + i;
            }
          }
          else {
            iVar3 = -1;
            if (uVar1 == 0) {
              iVar3 = 1;
            }
            i = iVar3 * 10 + i;
          }
        }
        else if (Board::PIECE_NO_TEAM[local_28] == 5) {
          puVar6 = Board::getPawns(pos);
          if (((ulong)(puVar6[2] == 0) & Board::FILE_MASK[Board::FILES[iVar3]]) == 0) {
            puVar6 = Board::getPawns(pos);
            if (((ulong)(puVar6[(int)uVar1] == 0) & Board::FILE_MASK[Board::FILES[iVar3]]) != 0) {
              iVar3 = -1;
              if (uVar1 == 0) {
                iVar3 = 1;
              }
              i = iVar3 * 3 + i;
            }
          }
          else {
            iVar3 = -1;
            if (uVar1 == 0) {
              iVar3 = 1;
            }
            i = iVar3 * 5 + i;
          }
        }
      }
    }
    iVar3 = Board::getSide(pos);
    if (iVar3 == 1) {
      i = -i;
    }
    pos_local._4_4_ = i;
  }
  return pos_local._4_4_;
}

Assistant:

int board::evaluate::score(Board& pos)
{
    if (materialDraw(pos)) {
        return 0;
    }
    int square;
    int side;
    int score = pos.getMaterial(WHITE) - pos.getMaterial(BLACK);
    if (pos.getPieceNum(WB) == 2) {
        score += BISHOP_PAIR;
    }
    if (pos.getPieceNum(BB) == 2) {
        score -= BISHOP_PAIR;
    }
    for (int piece = WP; piece <= BK; piece++) {
        for (int i = 0; i < pos.getPieceNum(piece); i++) {
            square = pos.getPieceList(piece)[i];
            side = Board::PIECE_COLOR[piece];
            if (Board::PIECE_COLOR[piece] == WHITE) {
                score += PIECE_SQUARE_TABLE[Board::PIECE_NO_TEAM[piece]][Board::SQ64[square]];
            }
            else {
                score -=
                    PIECE_SQUARE_TABLE[Board::PIECE_NO_TEAM[piece]][MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
            }
            if (piece == WK) {
                if (isEndGame(pos, WHITE)) {
                    score += PIECE_SQUARE_TABLE_KING_END[Board::SQ64[square]];
                }
                else {
                    score += PIECE_SQUARE_TABLE_KING_OPENING[Board::SQ64[square]];
                }
            }
            else if (piece == BK) {
                if (isEndGame(pos, BLACK)) {
                    score -= PIECE_SQUARE_TABLE_KING_END[MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
                }
                else {
                    score -= PIECE_SQUARE_TABLE_KING_OPENING[MIRROR_PIECE_SQUARE_TABLE[Board::SQ64[square]]];
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WP) {
                if ((!pos.getPawns()[side]) & Board::ISOLATED_PAWN_MASK[Board::SQ64[square]]) {
                    score += PAWN_ISOLATED * (side == WHITE ? 1 : -1);
                }
                if ((!pos.getPawns()[side ^ 1]) & Board::PASSED_PAWN_MASK[side][Board::SQ64[square]]) {
                    score += PASSED_PAWN[Board::RANKS[square]] * (side == WHITE ? 1 : -1);
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WR) {
                if ((!pos.getPawns()[BOTH]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += ROOK_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
                else if ((!pos.getPawns()[side]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += ROOK_SEMI_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
            }
            else if (Board::PIECE_NO_TEAM[piece] == WQ) {
                if ((!pos.getPawns()[BOTH]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += QUEEN_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
                else if ((!pos.getPawns()[side]) & Board::FILE_MASK[Board::FILES[square]]) {
                    score += QUEEN_SEMI_OPEN_FILE * (side == WHITE ? 1 : -1);
                }
            }
        }
    }
    if (pos.getSide() == BLACK) {
        score = -score;
    }
    return score;
}